

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

_Bool sx_ishex(char *str)

{
  char ch;
  _Bool _Var1;
  
  do {
    ch = *str;
    if (ch == '\0') break;
    _Var1 = sx_ishexchar(ch);
    str = str + 1;
  } while (_Var1);
  return ch == '\0';
}

Assistant:

bool sx_ishex(const char* str)
{
    while (*str) {
        if (!sx_ishexchar(*str))
            return false;
        ++str;
    }
    return true;
}